

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Driver.cpp
# Opt level: O0

void __thiscall Nova::Driver<float,_2>::Read_Time(Driver<float,_2> *this,int frame)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  float fVar4;
  float local_a8 [2];
  float corrected_time;
  __cxx11 local_98 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38 [8];
  string filename;
  int frame_local;
  Driver<float,_2> *this_local;
  
  fVar4 = Example<float,_2>::Time_At_Frame(this->example,frame);
  this->time = fVar4;
  std::operator+(local_78,(char *)&this->example->output_directory);
  std::__cxx11::to_string(local_98,frame);
  std::operator+(local_58,local_78);
  std::operator+(local_38,(char *)local_58);
  std::__cxx11::string::~string((string *)local_58);
  std::__cxx11::string::~string((string *)local_98);
  std::__cxx11::string::~string((string *)local_78);
  bVar1 = File_Utilities::File_Exists(local_38,true);
  if (bVar1) {
    File_Utilities::Read_From_File<float>(local_38,local_a8);
    iVar3 = (int)(this->time - local_a8[0]);
    if (iVar3 < 1) {
      iVar3 = -iVar3;
    }
    iVar2 = (int)this->time;
    if (iVar2 < 1) {
      iVar2 = -iVar2;
    }
    if ((float)iVar2 * 0.0001 < (float)iVar3) {
      this->time = local_a8[0];
      this->example->initial_time =
           this->time - (float)(frame - this->example->first_frame) / this->example->frame_rate;
    }
  }
  std::__cxx11::string::~string((string *)local_38);
  return;
}

Assistant:

void Driver<T,d>::
Read_Time(const int frame)
{
    time=example.Time_At_Frame(frame);
    std::string filename=example.output_directory+"/"+std::to_string(frame)+"/time";
    if(File_Utilities::File_Exists(filename))
    {
        T corrected_time;
        File_Utilities::Read_From_File<T>(filename,corrected_time);
        if(abs(time-corrected_time)>(T)1e-4*abs(time))
        {   
            // only adjust time if significantly different from default in order to get deterministic restarts
            time=corrected_time;
            // adjust initial time so that Simulate_To_Frame() returns correct time (essential when writing substeps)
            example.initial_time=time-(frame-example.first_frame)/example.frame_rate;
        }
    }
}